

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

ostream * ccd::Json::operator<<(ostream *os,Object *obj)

{
  ostream *os_00;
  undefined1 *puVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  
  if (operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
      ::indentLvlIdx == '\0') {
    operator<<();
  }
  if ((uint)operator<<::indentLvlIdx < *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0xc0)) {
    lVar7 = (long)operator<<::indentLvlIdx * 0x10 +
            *(long *)(os + *(long *)(*(long *)os + -0x18) + 200);
  }
  else {
    lVar7 = std::ios_base::_M_grow_words
                      ((int)(os + *(long *)(*(long *)os + -0x18)),SUB41(operator<<::indentLvlIdx,0))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  *(long *)(lVar7 + 8) = *(long *)(lVar7 + 8) + 1;
  p_Var6 = &(obj->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var2 = (obj->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var6;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    for (iVar3 = *(int *)(lVar7 + 8); iVar3 != 0; iVar3 = iVar3 + -1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    os_00 = std::__ostream_insert<char,std::char_traits<char>>
                      (os,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(os_00,"\":",2);
    operator<<(os_00,(Value *)(p_Var2 + 2));
    puVar1 = (undefined1 *)std::_Rb_tree_increment(p_Var2);
    if ((_Rb_tree_header *)puVar1 != p_Var6) {
      std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  uVar5 = *(long *)(lVar7 + 8) - 1;
  *(ulong *)(lVar7 + 8) = uVar5;
  uVar4 = (uint)uVar5;
  while (uVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  return os;
}

Assistant:

std::ostream& operator<< ( std::ostream& os, const Object& obj )
{
	static const int indentLvlIdx =  os.xalloc();
	auto& indentLvl = os.iword(indentLvlIdx);
	os << "{\n";
	indentLvl++;

	for ( auto item = obj.cbegin() ; item != obj.cend(); ++item ) {
		indent ( os, indentLvl );
		os << "\"" << item->first << "\":" << item->second;
		if ( std::next(item, 1) != obj.cend() )
			os << ",\n";
	}
	os << "\n";

	indentLvl--;
	indent ( os, indentLvl );
	os << "}";

	return os;
}